

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

FramebufferGLImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::FramebufferGLImpl,Diligent::FixedBlockMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::FramebufferGLImpl,Diligent::FixedBlockMemoryAllocator> *this,
          RenderDeviceGLImpl **CtorArgs,FramebufferDesc *CtorArgs_1,
          reference_wrapper<Diligent::GLContextState> *CtorArgs_2)

{
  RenderDeviceGLImpl *pRVar1;
  GLContextState *pGVar2;
  RenderDeviceGLImpl **ppRVar3;
  FramebufferGLImpl *local_40;
  FramebufferGLImpl *pObj;
  IReferenceCounters *pRefCounters;
  RefCountersImpl *pNewRefCounters;
  reference_wrapper<Diligent::GLContextState> *CtorArgs_local_2;
  FramebufferDesc *CtorArgs_local_1;
  RenderDeviceGLImpl **CtorArgs_local;
  MakeNewRCObj<Diligent::FramebufferGLImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  pRefCounters = (IReferenceCounters *)0x0;
  ppRVar3 = CtorArgs;
  if (*(long *)(this + 8) == 0) {
    pObj = (FramebufferGLImpl *)::operator_new(0x30);
    RefCountersImpl::RefCountersImpl((RefCountersImpl *)pObj);
    pRefCounters = (IReferenceCounters *)pObj;
  }
  else {
    pObj = (FramebufferGLImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
  }
  if (*(long *)this == 0) {
    local_40 = (FramebufferGLImpl *)
               RefCountedObject<Diligent::IFramebuffer>::operator_new
                         ((RefCountedObject<Diligent::IFramebuffer> *)0x80,(size_t)ppRVar3);
    pRVar1 = *CtorArgs;
    pGVar2 = std::reference_wrapper::operator_cast_to_GLContextState_
                       ((reference_wrapper *)CtorArgs_2);
    FramebufferGLImpl::FramebufferGLImpl
              (local_40,(IReferenceCounters *)pObj,pRVar1,CtorArgs_1,pGVar2);
  }
  else {
    local_40 = (FramebufferGLImpl *)
               ::new<Diligent::FixedBlockMemoryAllocator>
                         (0x80,*(FixedBlockMemoryAllocator **)this,*(Char **)(this + 0x10),
                          *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
    pRVar1 = *CtorArgs;
    pGVar2 = std::reference_wrapper::operator_cast_to_GLContextState_
                       ((reference_wrapper *)CtorArgs_2);
    FramebufferGLImpl::FramebufferGLImpl
              (local_40,(IReferenceCounters *)pObj,pRVar1,CtorArgs_1,pGVar2);
  }
  if (pRefCounters != (IReferenceCounters *)0x0) {
    RefCountersImpl::Attach<Diligent::FramebufferGLImpl,Diligent::FixedBlockMemoryAllocator>
              ((RefCountersImpl *)pRefCounters,local_40,*(FixedBlockMemoryAllocator **)this);
  }
  return local_40;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }